

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

float * stbi__hdr_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  bool bVar1;
  byte bVar2;
  stbi_uc sVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  stbi__context *s_00;
  long lVar7;
  float *__ptr;
  undefined4 *in_RCX;
  int *in_RDX;
  uint *in_RSI;
  int in_R8D;
  int nleft;
  stbi_uc rgbe_1 [4];
  stbi_uc rgbe [4];
  char *headerToken;
  int z;
  int c2;
  int c1;
  int k;
  int j;
  int i;
  uchar value;
  uchar count;
  int len;
  float *hdr_data;
  stbi_uc *scanline;
  int height;
  int width;
  int valid;
  char *token;
  char buffer [1024];
  int in_stack_fffffffffffffb68;
  int in_stack_fffffffffffffb6c;
  stbi_uc in_stack_fffffffffffffb70;
  undefined1 in_stack_fffffffffffffb71;
  byte in_stack_fffffffffffffb72;
  stbi_uc in_stack_fffffffffffffb73;
  int in_stack_fffffffffffffb74;
  int in_stack_fffffffffffffb80;
  uint in_stack_fffffffffffffb84;
  int local_474;
  int local_470;
  int local_46c;
  void *local_458;
  char *local_440 [130];
  int local_2c;
  undefined4 *local_28;
  int *local_20;
  uint *local_18;
  float *local_8;
  
  bVar1 = false;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  s_00 = (stbi__context *)
         stbi__hdr_gettoken((stbi__context *)
                            CONCAT44(in_stack_fffffffffffffb74,
                                     CONCAT13(in_stack_fffffffffffffb73,
                                              CONCAT12(in_stack_fffffffffffffb72,
                                                       CONCAT11(in_stack_fffffffffffffb71,
                                                                in_stack_fffffffffffffb70)))),
                            (char *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
  iVar4 = strcmp((char *)s_00,"#?RADIANCE");
  if ((iVar4 == 0) || (iVar4 = strcmp((char *)s_00,"#?RGBE"), iVar4 == 0)) {
    while (local_440[0] = stbi__hdr_gettoken((stbi__context *)
                                             CONCAT44(in_stack_fffffffffffffb74,
                                                      CONCAT13(in_stack_fffffffffffffb73,
                                                               CONCAT12(in_stack_fffffffffffffb72,
                                                                        CONCAT11(
                                                  in_stack_fffffffffffffb71,
                                                  in_stack_fffffffffffffb70)))),
                                             (char *)CONCAT44(in_stack_fffffffffffffb6c,
                                                              in_stack_fffffffffffffb68)),
          *local_440[0] != '\0') {
      iVar4 = strcmp(local_440[0],"FORMAT=32-bit_rle_rgbe");
      if (iVar4 == 0) {
        bVar1 = true;
      }
    }
    if (bVar1) {
      local_440[0] = stbi__hdr_gettoken((stbi__context *)
                                        CONCAT44(in_stack_fffffffffffffb74,
                                                 CONCAT13(in_stack_fffffffffffffb73,
                                                          CONCAT12(in_stack_fffffffffffffb72,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffffb71,
                                                  in_stack_fffffffffffffb70)))),
                                        (char *)CONCAT44(in_stack_fffffffffffffb6c,
                                                         in_stack_fffffffffffffb68));
      iVar4 = strncmp(local_440[0],"-Y ",3);
      if (iVar4 == 0) {
        local_440[0] = local_440[0] + 3;
        lVar7 = strtol(local_440[0],local_440,10);
        iVar4 = (int)lVar7;
        for (; *local_440[0] == ' '; local_440[0] = local_440[0] + 1) {
        }
        iVar5 = strncmp(local_440[0],"+X ",3);
        if (iVar5 == 0) {
          local_440[0] = local_440[0] + 3;
          lVar7 = strtol(local_440[0],(char **)0x0,10);
          uVar6 = (uint)lVar7;
          *local_18 = uVar6;
          *local_20 = iVar4;
          if (local_28 != (undefined4 *)0x0) {
            *local_28 = 3;
          }
          if (local_2c == 0) {
            local_2c = 3;
          }
          iVar5 = stbi__mad4sizes_valid
                            (in_stack_fffffffffffffb74,
                             CONCAT13(in_stack_fffffffffffffb73,
                                      CONCAT12(in_stack_fffffffffffffb72,
                                               CONCAT11(in_stack_fffffffffffffb71,
                                                        in_stack_fffffffffffffb70))),
                             in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68,0);
          if (iVar5 == 0) {
            stbi__err("too large");
            local_8 = (float *)0x0;
          }
          else {
            __ptr = (float *)stbi__malloc_mad4((int)((ulong)s_00 >> 0x20),(int)s_00,
                                               in_stack_fffffffffffffb74,
                                               CONCAT13(in_stack_fffffffffffffb73,
                                                        CONCAT12(in_stack_fffffffffffffb72,
                                                                 CONCAT11(in_stack_fffffffffffffb71,
                                                                          in_stack_fffffffffffffb70)
                                                                )),in_stack_fffffffffffffb6c);
            if (__ptr == (float *)0x0) {
              stbi__err("outofmem");
              local_8 = (float *)0x0;
            }
            else {
              if (((int)uVar6 < 8) || (0x7fff < (int)uVar6)) {
                local_470 = 0;
                goto LAB_0028908f;
              }
              local_458 = (void *)0x0;
              for (local_470 = 0; local_470 < iVar4; local_470 = local_470 + 1) {
                in_stack_fffffffffffffb70 =
                     stbi__get8((stbi__context *)
                                CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
                bVar2 = stbi__get8((stbi__context *)
                                   CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
                in_stack_fffffffffffffb84 = (uint)bVar2;
                in_stack_fffffffffffffb72 =
                     stbi__get8((stbi__context *)
                                CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
                if (((in_stack_fffffffffffffb70 != '\x02') || (in_stack_fffffffffffffb84 != 2)) ||
                   ((in_stack_fffffffffffffb72 & 0x80) != 0)) {
                  in_stack_fffffffffffffb71 = (undefined1)in_stack_fffffffffffffb84;
                  in_stack_fffffffffffffb73 =
                       stbi__get8((stbi__context *)
                                  CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
                  stbi__hdr_convert((float *)CONCAT44(in_stack_fffffffffffffb84,
                                                      in_stack_fffffffffffffb80),(stbi_uc *)s_00,
                                    in_stack_fffffffffffffb74);
                  local_46c = 1;
                  local_470 = 0;
                  free(local_458);
                  do {
                    stbi__getn(s_00,(stbi_uc *)
                                    CONCAT44(in_stack_fffffffffffffb74,
                                             CONCAT13(in_stack_fffffffffffffb73,
                                                      CONCAT12(in_stack_fffffffffffffb72,
                                                               CONCAT11(in_stack_fffffffffffffb71,
                                                                        in_stack_fffffffffffffb70)))
                                            ),in_stack_fffffffffffffb6c);
                    stbi__hdr_convert((float *)CONCAT44(in_stack_fffffffffffffb84,
                                                        in_stack_fffffffffffffb80),(stbi_uc *)s_00,
                                      in_stack_fffffffffffffb74);
                    local_46c = local_46c + 1;
                    while ((int)uVar6 <= local_46c) {
                      local_470 = local_470 + 1;
LAB_0028908f:
                      if (iVar4 <= local_470) {
                        return __ptr;
                      }
                      local_46c = 0;
                    }
                  } while( true );
                }
                sVar3 = stbi__get8((stbi__context *)
                                   CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
                if (CONCAT11(in_stack_fffffffffffffb72,sVar3) != uVar6) {
                  free(__ptr);
                  free(local_458);
                  stbi__err("invalid decoded scanline length");
                  return (float *)0x0;
                }
                if ((local_458 == (void *)0x0) &&
                   (local_458 = stbi__malloc_mad2(in_stack_fffffffffffffb6c,
                                                  in_stack_fffffffffffffb68,0),
                   local_458 == (void *)0x0)) {
                  free(__ptr);
                  stbi__err("outofmem");
                  return (float *)0x0;
                }
                for (local_474 = 0; local_474 < 4; local_474 = local_474 + 1) {
                  local_46c = 0;
                  while (in_stack_fffffffffffffb6c = uVar6 - local_46c,
                        0 < in_stack_fffffffffffffb6c) {
                    bVar2 = stbi__get8((stbi__context *)
                                       CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68)
                                      );
                    if (bVar2 < 0x81) {
                      if (in_stack_fffffffffffffb6c < (int)(uint)bVar2) {
                        free(__ptr);
                        free(local_458);
                        stbi__err("corrupt");
                        return (float *)0x0;
                      }
                      for (in_stack_fffffffffffffb80 = 0;
                          in_stack_fffffffffffffb80 < (int)(uint)bVar2;
                          in_stack_fffffffffffffb80 = in_stack_fffffffffffffb80 + 1) {
                        sVar3 = stbi__get8((stbi__context *)
                                           CONCAT44(in_stack_fffffffffffffb6c,
                                                    in_stack_fffffffffffffb68));
                        *(stbi_uc *)((long)local_458 + (long)(local_46c * 4 + local_474)) = sVar3;
                        local_46c = local_46c + 1;
                      }
                    }
                    else {
                      sVar3 = stbi__get8((stbi__context *)
                                         CONCAT44(in_stack_fffffffffffffb6c,
                                                  in_stack_fffffffffffffb68));
                      if (in_stack_fffffffffffffb6c < (int)(uint)(byte)(bVar2 + 0x80)) {
                        free(__ptr);
                        free(local_458);
                        stbi__err("corrupt");
                        return (float *)0x0;
                      }
                      for (in_stack_fffffffffffffb80 = 0;
                          in_stack_fffffffffffffb80 < (int)(uint)(byte)(bVar2 + 0x80);
                          in_stack_fffffffffffffb80 = in_stack_fffffffffffffb80 + 1) {
                        *(stbi_uc *)((long)local_458 + (long)(local_46c * 4 + local_474)) = sVar3;
                        local_46c = local_46c + 1;
                      }
                    }
                  }
                }
                for (local_46c = 0; local_46c < (int)uVar6; local_46c = local_46c + 1) {
                  stbi__hdr_convert((float *)CONCAT44(in_stack_fffffffffffffb84,
                                                      in_stack_fffffffffffffb80),(stbi_uc *)s_00,
                                    in_stack_fffffffffffffb74);
                }
              }
              local_8 = __ptr;
              if (local_458 != (void *)0x0) {
                free(local_458);
              }
            }
          }
        }
        else {
          stbi__err("unsupported data layout");
          local_8 = (float *)0x0;
        }
      }
      else {
        stbi__err("unsupported data layout");
        local_8 = (float *)0x0;
      }
    }
    else {
      stbi__err("unsupported format");
      local_8 = (float *)0x0;
    }
  }
  else {
    stbi__err("not HDR");
    local_8 = (float *)0x0;
  }
  return local_8;
}

Assistant:

static float *stbi__hdr_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int width, height;
   stbi_uc *scanline;
   float *hdr_data;
   int len;
   unsigned char count, value;
   int i, j, k, c1,c2, z;
   const char *headerToken;
   STBI_NOTUSED(ri);

   // Check identifier
   headerToken = stbi__hdr_gettoken(s,buffer);
   if (strcmp(headerToken, "#?RADIANCE") != 0 && strcmp(headerToken, "#?RGBE") != 0)
      return stbi__errpf("not HDR", "Corrupt HDR image");

   // Parse header
   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid)    return stbi__errpf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = (int) strtol(token, NULL, 10);

   *x = width;
   *y = height;

   if (comp) *comp = 3;
   if (req_comp == 0) req_comp = 3;

   if (!stbi__mad4sizes_valid(width, height, req_comp, sizeof(float), 0))
      return stbi__errpf("too large", "HDR image is too large");

   // Read data
   hdr_data = (float *) stbi__malloc_mad4(width, height, req_comp, sizeof(float), 0);
   if (!hdr_data)
      return stbi__errpf("outofmem", "Out of memory");

   // Load image data
   // image data is stored as some number of sca
   if ( width < 8 || width >= 32768) {
      // Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            stbi__getn(s, rgbe, 4);
            stbi__hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
   } else {
      // Read RLE-encoded data
      scanline = NULL;

      for (j = 0; j < height; ++j) {
         c1 = stbi__get8(s);
         c2 = stbi__get8(s);
         len = stbi__get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4];
            rgbe[0] = (stbi_uc) c1;
            rgbe[1] = (stbi_uc) c2;
            rgbe[2] = (stbi_uc) len;
            rgbe[3] = (stbi_uc) stbi__get8(s);
            stbi__hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            STBI_FREE(scanline);
            goto main_decode_loop; // yes, this makes no sense
         }
         len <<= 8;
         len |= stbi__get8(s);
         if (len != width) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) {
            scanline = (stbi_uc *) stbi__malloc_mad2(width, 4, 0);
            if (!scanline) {
               STBI_FREE(hdr_data);
               return stbi__errpf("outofmem", "Out of memory");
            }
         }

         for (k = 0; k < 4; ++k) {
            int nleft;
            i = 0;
            while ((nleft = width - i) > 0) {
               count = stbi__get8(s);
               if (count > 128) {
                  // Run
                  value = stbi__get8(s);
                  count -= 128;
                  if (count > nleft) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = value;
               } else {
                  // Dump
                  if (count > nleft) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = stbi__get8(s);
               }
            }
         }
         for (i=0; i < width; ++i)
            stbi__hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
      }
      if (scanline)
         STBI_FREE(scanline);
   }

   return hdr_data;
}